

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

void start_watcher(uv_loop_t *loop,int signum,signal_ctx *ctx,int one_shot)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *puVar4;
  long lVar5;
  uv_signal_t *handle;
  uv_handle_t *puVar6;
  uv_signal_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_7e0 [144];
  undefined1 auStack_750 [136];
  undefined1 auStack_6c8 [136];
  undefined1 auStack_640 [136];
  signal_ctx sStack_5b8;
  uv_loop_t *puStack_528;
  void *pvStack_4d8;
  undefined1 auStack_4d0 [144];
  signal_ctx sStack_440;
  uv_loop_t *puStack_3b8;
  timer_ctx *ptStack_3b0;
  ulong uStack_3a8;
  ulong uStack_3a0;
  timer_ctx tStack_398;
  timer_ctx tStack_310;
  signal_ctx sStack_288;
  signal_ctx sStack_200;
  signal_ctx sStack_178;
  signal_ctx sStack_f0;
  ulong uStack_68;
  uv_signal_t *puStack_60;
  code *pcStack_58;
  long lStack_48;
  code *pcStack_40;
  undefined8 local_30;
  void *local_28;
  
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->ncalls = 0;
  ctx->one_shot = one_shot;
  handle_00 = &ctx->handle;
  pcStack_40 = (code *)0x1b9ba9;
  iVar2 = uv_signal_init(loop,handle_00);
  local_28 = (void *)(long)iVar2;
  local_30 = 0;
  if (local_28 == (void *)0x0) {
    pvVar1 = (void *)0x0;
    if (one_shot != 0) {
      pcStack_40 = (code *)0x1b9bd6;
      iVar2 = uv_signal_start_oneshot(handle_00,signal_cb_one_shot,signum);
      local_28 = (void *)(long)iVar2;
      local_30 = 0;
      if (local_28 == (void *)0x0) {
        return;
      }
      pcStack_40 = (code *)0x1b9c01;
      start_watcher_cold_2();
      pvVar1 = local_28;
    }
    local_28 = pvVar1;
    pcStack_40 = (code *)0x1b9c12;
    iVar2 = uv_signal_start(handle_00,signal_cb,signum);
    local_28 = (void *)(long)iVar2;
    local_30 = 0;
    if (local_28 == (void *)0x0) {
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x1b9c48;
    start_watcher_cold_1();
  }
  handle = (uv_signal_t *)&stack0xffffffffffffffd8;
  iVar2 = (int)&local_30;
  pcStack_40 = signal_cb;
  start_watcher_cold_3();
  pcStack_40 = (code *)(long)iVar2;
  lStack_48 = (long)*(int *)&handle[1].data;
  if (pcStack_40 == (code *)lStack_48) {
    uVar3 = handle[-1].dispatched_signals + 1;
    handle[-1].dispatched_signals = uVar3;
    if (uVar3 != 10) {
      return;
    }
    if (handle[-1].caught_signals == 0) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
    if (handle[-1].caught_signals == 1) {
      uv_signal_stop(handle);
      return;
    }
  }
  else {
    pcStack_58 = (code *)0x1b9cb9;
    signal_cb_cold_1();
  }
  pcStack_58 = run_test_we_get_signals;
  signal_cb_cold_2();
  pcStack_58 = (code *)0x0;
  ptStack_3b0 = (timer_ctx *)0x1b9ccf;
  uStack_68 = (ulong)(uint)signum;
  puStack_60 = handle_00;
  puVar4 = uv_default_loop();
  ptStack_3b0 = (timer_ctx *)0x1b9cec;
  start_watcher(puVar4,10,&sStack_288,0);
  ptStack_3b0 = (timer_ctx *)0x1b9d07;
  start_watcher(puVar4,10,&sStack_200,0);
  ptStack_3b0 = (timer_ctx *)0x1b9d1e;
  start_watcher(puVar4,0xc,&sStack_178,0);
  ptStack_3b0 = (timer_ctx *)0x1b9d35;
  start_watcher(puVar4,0xc,&sStack_f0,0);
  ptStack_3b0 = (timer_ctx *)0x1b9d4a;
  start_timer(puVar4,10,&tStack_398);
  ptStack_3b0 = (timer_ctx *)0x1b9d5d;
  start_timer(puVar4,0xc,&tStack_310);
  ptStack_3b0 = (timer_ctx *)0x1b9d67;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  uStack_3a0 = (ulong)iVar2;
  uStack_3a8 = 0;
  if (uStack_3a0 != 0) goto LAB_001b9e51;
  lVar5 = 4;
  do {
    uStack_3a0 = (ulong)*(uint *)((long)&sStack_288.stop_or_close + lVar5);
    uStack_3a8 = 10;
    if (uStack_3a0 != 10) {
      ptStack_3b0 = (timer_ctx *)0x1b9e44;
      run_test_we_get_signals_cold_2();
      goto LAB_001b9e44;
    }
    lVar5 = lVar5 + 0x88;
  } while (lVar5 != 0x224);
  lVar5 = 0;
  do {
    uStack_3a0 = (ulong)*(uint *)((long)&tStack_398.ncalls + lVar5);
    uStack_3a8 = 10;
    if (uStack_3a0 != 10) goto LAB_001b9e44;
    lVar5 = lVar5 + 0x88;
  } while (lVar5 == 0x88);
  ptStack_3b0 = (timer_ctx *)0x1b9df7;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  ptStack_3b0 = (timer_ctx *)0x1b9e01;
  uv_run(puVar4,UV_RUN_DEFAULT);
  uStack_3a0 = 0;
  ptStack_3b0 = (timer_ctx *)0x1b9e12;
  iVar2 = uv_loop_close(puVar4);
  uStack_3a8 = (ulong)iVar2;
  if (uStack_3a0 == uStack_3a8) {
    ptStack_3b0 = (timer_ctx *)0x1b9e28;
    uv_library_shutdown();
    return;
  }
LAB_001b9e5e:
  ptStack_3b0 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_3b8 = puVar4;
  ptStack_3b0 = &tStack_310;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_4d0 + 8));
  start_watcher(puVar4,0x11,&sStack_440,1);
  sStack_440.stop_or_close = NOOP;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_4d0._0_8_ = SEXT48(iVar2);
  pvStack_4d8 = (void *)0x0;
  if ((void *)auStack_4d0._0_8_ == (void *)0x0) {
    auStack_4d0._0_8_ = ZEXT48((uint)auStack_4d0._8_4_);
    pvStack_4d8 = (void *)0xa;
    if ((void *)auStack_4d0._0_8_ != (void *)0xa) goto LAB_001ba088;
    auStack_4d0._0_8_ = (void *)0x1;
    pvStack_4d8 = (void *)(ulong)sStack_440.ncalls;
    if (pvStack_4d8 != (void *)0x1) goto LAB_001ba097;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_4d0 + 8));
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_4d0._0_8_ = SEXT48(iVar2);
    pvStack_4d8 = (void *)0x0;
    if ((void *)auStack_4d0._0_8_ != (void *)0x0) goto LAB_001ba0a6;
    auStack_4d0._0_8_ = (void *)0x1;
    pvStack_4d8 = (void *)(ulong)sStack_440.ncalls;
    if (pvStack_4d8 != (void *)0x1) goto LAB_001ba0b5;
    sStack_440.stop_or_close = CLOSE;
    sStack_440.ncalls = 0;
    uv_signal_start_oneshot(&sStack_440.handle,signal_cb_one_shot,0x11);
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_4d0 + 8));
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_4d0._0_8_ = SEXT48(iVar2);
    pvStack_4d8 = (void *)0x0;
    if ((void *)auStack_4d0._0_8_ != (void *)0x0) goto LAB_001ba0c4;
    auStack_4d0._0_8_ = ZEXT48((uint)auStack_4d0._8_4_);
    pvStack_4d8 = (void *)0xa;
    if ((void *)auStack_4d0._0_8_ != (void *)0xa) goto LAB_001ba0d3;
    auStack_4d0._0_8_ = (void *)0x1;
    pvStack_4d8 = (void *)(ulong)sStack_440.ncalls;
    if (pvStack_4d8 != (void *)0x1) goto LAB_001ba0e2;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_4d0._0_8_ = (void *)0x0;
    iVar2 = uv_loop_close(puVar4);
    pvStack_4d8 = (void *)(long)iVar2;
    if ((void *)auStack_4d0._0_8_ == pvStack_4d8) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba088:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba097:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0a6:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0b5:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0c4:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba0d3:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba0e2:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar6 = (uv_handle_t *)auStack_4d0;
  uVar3 = (uint)&pvStack_4d8;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar3 == puVar6[1].flags) {
    iVar2 = *(int *)&puVar6[-1].field_0x3c + 1;
    *(int *)&puVar6[-1].field_0x3c = iVar2;
    if (iVar2 == 1) {
      if (puVar6[-1].flags != 0) {
        return;
      }
      uv_close(puVar6,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_528 = puVar4;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_7e0 + 8));
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_750,1);
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_6c8,1);
  auStack_750._0_4_ = CLOSE;
  auStack_6c8._0_4_ = CLOSE;
  iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_7e0._0_8_ = SEXT48(iVar2);
  if ((void *)auStack_7e0._0_8_ == (void *)0x0) {
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_7e0._8_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba820;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_750._4_4_ != 1) goto LAB_001ba82f;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_6c8._4_4_ != 1) goto LAB_001ba83e;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_7e0 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_750,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_6c8,1);
    auStack_750._0_4_ = CLOSE;
    auStack_6c8._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_640,0);
    uv_close((uv_handle_t *)(auStack_640 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_7e0._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba84d;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_7e0._8_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba85c;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_750._4_4_ != 1) goto LAB_001ba86b;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_6c8._4_4_ != 1) goto LAB_001ba87a;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_640._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba889;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_7e0 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_750,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_6c8,0);
    auStack_750._0_4_ = CLOSE;
    auStack_6c8._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_640,1);
    uv_close((uv_handle_t *)(auStack_640 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_7e0._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba898;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_7e0._8_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba8a7;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_750._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba8b6;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_6c8._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba8c5;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_640._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba8d4;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_7e0 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_750,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_6c8,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_640,1);
    start_watcher(puVar4,0x11,&sStack_5b8,1);
    auStack_640._0_4_ = CLOSE;
    sStack_5b8.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_750 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_6c8 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_7e0._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba8e3;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_7e0._8_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba8f2;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_750._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba901;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_6c8._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba910;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_640._4_4_ != 1) goto LAB_001ba91f;
    auStack_7e0._0_8_ = (void *)0x1;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_7e0 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_750,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_6c8,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_640,0);
    start_watcher(puVar4,0x11,&sStack_5b8,0);
    sStack_5b8.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_750 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_640 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_7e0._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba93d;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_7e0._8_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0xa) goto LAB_001ba94c;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_750._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba95b;
    auStack_7e0._0_8_ = (void *)0x1;
    if (auStack_6c8._4_4_ != 1) goto LAB_001ba96a;
    auStack_7e0._0_8_ = ZEXT48((uint)auStack_640._4_4_);
    if ((void *)auStack_7e0._0_8_ != (void *)0x0) goto LAB_001ba979;
    auStack_7e0._0_8_ = ZEXT48(sStack_5b8.ncalls);
    if ((void *)auStack_7e0._0_8_ == (void *)0xa) {
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      auStack_7e0._0_8_ = (void *)0x0;
      iVar2 = uv_loop_close(puVar4);
      if ((void *)auStack_7e0._0_8_ == (void *)(long)iVar2) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001ba997;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba820:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba82f:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba83e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba84d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba85c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba86b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba87a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba889:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba898:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8a7:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8b6:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8c5:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba8d4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba8e3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba8f2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba901:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba910:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba91f:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba93d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba94c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba95b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba96a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba979:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba997:
  puVar6 = (uv_handle_t *)auStack_7e0;
  run_test_we_get_signals_mixed_cold_27();
  iVar2 = uv_is_closing(puVar6);
  if (iVar2 != 0) {
    return;
  }
  uv_close(puVar6,(uv_close_cb)0x0);
  return;
LAB_001b9e44:
  ptStack_3b0 = (timer_ctx *)0x1b9e51;
  run_test_we_get_signals_cold_3();
LAB_001b9e51:
  ptStack_3b0 = (timer_ctx *)0x1b9e5e;
  run_test_we_get_signals_cold_1();
  goto LAB_001b9e5e;
}

Assistant:

static void start_watcher(uv_loop_t* loop,
                          int signum,
                          struct signal_ctx* ctx,
                          int one_shot) {
  ctx->ncalls = 0;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->one_shot = one_shot;
  ASSERT_OK(uv_signal_init(loop, &ctx->handle));
  if (one_shot)
    ASSERT_OK(uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum));
  else
    ASSERT_OK(uv_signal_start(&ctx->handle, signal_cb, signum));
}